

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O0

int __thiscall
cppcms::http::details::gzip_buf::do_write(gzip_buf *this,char *p,int n,int flush_flag)

{
  char *pcVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  long lVar5;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int have;
  int local_4;
  
  if ((*(long *)(in_RDI + 0xe8) == 0) || ((*(byte *)(in_RDI + 0x40) & 1) == 0)) {
    local_4 = -1;
  }
  else if ((in_EDX == 0) && (in_ECX == 0)) {
    local_4 = 0;
  }
  else {
    *(int *)(in_RDI + 0x80) = in_EDX;
    *(undefined8 *)(in_RDI + 0x78) = in_RSI;
    do {
      *(int *)(in_RDI + 0x98) = (int)*(undefined8 *)(in_RDI + 0xf8);
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x48),0);
      *(reference *)(in_RDI + 0x90) = pvVar3;
      deflate(in_RDI + 0x78,in_ECX);
      sVar4 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x48));
      iVar2 = *(int *)(in_RDI + 0x98);
      pcVar1 = *(char **)(in_RDI + 0xe8);
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x48),0);
      lVar5 = std::streambuf::sputn(pcVar1,(long)pvVar3);
      if (lVar5 != (int)sVar4 - iVar2) {
        *(undefined8 *)(in_RDI + 0xe8) = 0;
        return -1;
      }
    } while (*(int *)(in_RDI + 0x98) == 0);
    if (((in_ECX == 2) && (*(long *)(in_RDI + 0xe8) != 0)) &&
       (iVar2 = std::streambuf::pubsync(), iVar2 < 0)) {
      *(undefined8 *)(in_RDI + 0xe8) = 0;
      return -1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int do_write(char const *p,int n,int flush_flag)
		{
			if(!out_ || !opened_) {
				return -1;
			}

			if(n==0 && flush_flag==Z_NO_FLUSH) {
				return 0;
			}

			z_stream_.avail_in = n;
			z_stream_.next_in = (Bytef*)(p);

			do {
				z_stream_.avail_out = buffer_;
				z_stream_.next_out = (Bytef*)(&chunk_[0]);
				deflate(&z_stream_,flush_flag);
				int have = chunk_.size() - z_stream_.avail_out;
				if(out_->sputn(&chunk_[0],have)!=have) {
					out_ = 0;
					return -1;
				}
			} while(z_stream_.avail_out == 0);

			if(flush_flag == Z_SYNC_FLUSH && out_ && out_->pubsync() < 0) {
				out_ = 0;
				return -1;
			}

			return 0;
		}